

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O3

bool __thiscall
Memory::RecyclerHeapObjectInfo::ClearImplicitRootBitsForLargeHeapBlock(RecyclerHeapObjectInfo *this)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  LargeObjectHeader *this_00;
  undefined4 *in_FS_OFFSET;
  
  this_00 = (this->field_3).m_largeHeapBlockHeader;
  if (this_00 == (LargeObjectHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x8f2,"(m_largeHeapBlockHeader)","m_largeHeapBlockHeader");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
    this_00 = (this->field_3).m_largeHeapBlockHeader;
  }
  bVar3 = LargeObjectHeader::GetAttributes(this_00,this->m_recycler->Cookie);
  LargeObjectHeader::SetAttributes
            ((this->field_3).m_largeHeapBlockHeader,this->m_recycler->Cookie,bVar3 & 0xf7);
  return (bool)((bVar3 & 8) >> 3);
}

Assistant:

bool ClearImplicitRootBitsForLargeHeapBlock()
    {
        Assert(m_largeHeapBlockHeader);
        byte attributes = m_largeHeapBlockHeader->GetAttributes(m_recycler->Cookie);
        bool wasImplicitRoot = (attributes & ImplicitRootBit) != 0;
        m_largeHeapBlockHeader->SetAttributes(m_recycler->Cookie, attributes & ~ImplicitRootBit);
        return wasImplicitRoot;
    }